

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_curve.cpp
# Opt level: O2

void __thiscall ON_CurveArray::Destroy(ON_CurveArray *this)

{
  ON_Curve **__s;
  ulong uVar1;
  
  for (uVar1 = (ulong)(uint)(this->super_ON_SimpleArray<ON_Curve_*>).m_capacity;
      __s = (this->super_ON_SimpleArray<ON_Curve_*>).m_a, 0 < (int)uVar1; uVar1 = uVar1 - 1) {
    if (__s[uVar1 - 1] != (ON_Curve *)0x0) {
      (*(__s[uVar1 - 1]->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
      (this->super_ON_SimpleArray<ON_Curve_*>).m_a[uVar1 - 1] = (ON_Curve *)0x0;
    }
  }
  if (__s != (ON_Curve **)0x0) {
    memset(__s,0,(long)(this->super_ON_SimpleArray<ON_Curve_*>).m_capacity << 3);
  }
  (this->super_ON_SimpleArray<ON_Curve_*>).m_count = 0;
  return;
}

Assistant:

void ON_CurveArray::Destroy()
{
  int i = m_capacity;
  while ( i-- > 0 ) {
    if ( m_a[i] ) {
      delete m_a[i];
      m_a[i] = nullptr;
    }
  }
  Empty();
}